

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container.hpp
# Opt level: O3

void __thiscall
BasicContainer::BasicContainer
          (BasicContainer *this,vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_> *list)

{
  AABox *a;
  pointer ppBVar1;
  ulong uVar2;
  AABox local_80;
  vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_> *local_68;
  vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_> local_60;
  AABox local_48;
  
  (this->super_Primitive)._vptr_Primitive = (_func_int **)&PTR_intersect_0016a358;
  local_68 = &this->list;
  std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>::vector(local_68,list);
  this->root = (treenode *)0x0;
  local_80._0_8_ =
       (long)(list->super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>)._M_impl
             .super__Vector_impl_data._M_finish -
       (long)(list->super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>)._M_impl
             .super__Vector_impl_data._M_start >> 3;
  github111116::ConsoleLogger::log<char[20],unsigned_long,char[11]>
            (&console,(char (*) [20])"building SAH BVH of",(unsigned_long *)&local_80,
             (char (*) [11])"primitives");
  std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>::vector(&local_60,list);
  build(this,&local_60,&this->root);
  if (local_60.super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_60.
                          super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.
                          super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  (*((*(list->super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>)._M_impl.
       super__Vector_impl_data._M_start)->super_Primitive)._vptr_Primitive[1])(&local_80);
  a = &this->bound;
  (this->bound).z1 = local_80.z1;
  (this->bound).z2 = local_80.z2;
  a->x1 = local_80.x1;
  (this->bound).x2 = local_80.x2;
  (this->bound).y1 = local_80.y1;
  (this->bound).y2 = local_80.y2;
  ppBVar1 = (list->super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if (8 < (ulong)((long)(list->
                        super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)ppBVar1)) {
    uVar2 = 1;
    do {
      (*(ppBVar1[uVar2]->super_Primitive)._vptr_Primitive[1])(&local_48);
      operator+(&local_80,a,&local_48);
      (this->bound).z1 = local_80.z1;
      (this->bound).z2 = local_80.z2;
      a->x1 = local_80.x1;
      (this->bound).x2 = local_80.x2;
      (this->bound).y1 = local_80.y1;
      (this->bound).y2 = local_80.y2;
      uVar2 = uVar2 + 1;
      ppBVar1 = (list->super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>).
                _M_impl.super__Vector_impl_data._M_start;
    } while (uVar2 < (ulong)((long)(list->
                                   super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)ppBVar1 >> 3)
            );
  }
  return;
}

Assistant:

BasicContainer(const std::vector<BasicPrimitive*>& list): list(list)
	{
		console.log("building SAH BVH of", list.size(), "primitives");
		build(list, root);
		bound = list[0]->boundingVolume();
		for (int i=1; i<list.size(); ++i) {
			bound = bound + list[i]->boundingVolume();
		}
	}